

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_int>::encodeArray
          (FastPForImpl<4U,_unsigned_int> *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  logic_error *this_00;
  uint32_t *out_00;
  size_t length_00;
  size_t thisnvalue;
  undefined8 local_108;
  undefined1 local_100 [16];
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  checkifdivisibleby(length,0x80);
  *out = (uint32_t)length;
  puVar1 = in + length;
  out_00 = out + 1;
  uVar2 = *nvalue;
  *nvalue = 1;
  uVar3 = 1;
  for (; in != puVar1; in = in + length_00) {
    length_00 = (long)puVar1 - (long)in >> 2;
    if (in + this->PageSize < puVar1) {
      length_00 = (ulong)this->PageSize;
    }
    thisnvalue = 0;
    __encodeArray(this,in,length_00,out_00,&thisnvalue);
    uVar3 = *nvalue + thisnvalue;
    out_00 = out_00 + thisnvalue;
    *nvalue = uVar3;
  }
  if (uVar3 <= uVar2) {
    resetBuffer(this);
    return;
  }
  thisnvalue = (size_t)local_100;
  local_108 = 0;
  local_100[0] = 0;
  std::__cxx11::to_string(&local_d0,uVar2 << 2);
  std::operator+(&local_b0,"It is possible we have a buffer overrun. You reported having allocated "
                 ,&local_d0);
  std::operator+(&local_90,&local_b0," bytes for the compressed data but we needed ");
  std::__cxx11::to_string(&local_f0,*nvalue << 2);
  std::operator+(&local_70,&local_90,&local_f0);
  std::operator+(&local_50,&local_70,
                 " bytes. Please increase the available memory for compressed data or check the value of the last parameter provided  to the encodeArray method."
                );
  std::__cxx11::string::operator=((string *)&thisnvalue,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)&thisnvalue);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void encodeArray(const IntType *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    checkifdivisibleby(length, BlockSize);
    const IntType *const finalin(in + length);

    *out++ = static_cast<uint32_t>(length);
    const size_t oldnvalue = nvalue;
    nvalue = 1;
    while (in != finalin) {
      size_t thissize = static_cast<size_t>(
          finalin > PageSize + in ? PageSize : (finalin - in));
      size_t thisnvalue(0);
      __encodeArray(in, thissize, out, thisnvalue);
      nvalue += thisnvalue;
      out += thisnvalue;
      in += thissize;
    }
    if (oldnvalue < nvalue) {
      std::string msg;
      msg = "It is possible we have a buffer overrun. You reported having "
            "allocated "
          + std::to_string(oldnvalue * sizeof(uint32_t))
          + " bytes for the compressed data but we needed "
          + std::to_string(nvalue * sizeof(uint32_t))
          + " bytes. Please increase the available memory"
            " for compressed data or check the value of the last parameter "
            "provided "
            " to the encodeArray method.";
      throw std::logic_error(msg);
    }
    resetBuffer();  // if you don't do this, the buffer has a memory
  }